

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O3

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getMeasurement
          (DynamicalSystemSimulator *this,TimeIndex k)

{
  long lVar1;
  long lVar2;
  DenseStorage<double,__1,__1,_1,_0> *other;
  ulong uVar3;
  long in_RDX;
  long lVar4;
  Index extraout_RDX;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Vector VVar10;
  
  lVar5 = *(long *)(k + 0xb8);
  lVar1 = *(long *)(k + 0x98);
  lVar4 = lVar5 - lVar1 >> 3;
  lVar7 = *(long *)(k + 0xa0) - *(long *)(k + 0xa8) >> 4;
  lVar2 = *(long *)(k + 0x80);
  lVar8 = *(long *)(k + 0x90) - lVar2 >> 4;
  lVar9 = (lVar4 + -1 + (ulong)(lVar5 == 0)) * 0x20 + lVar7 + lVar8;
  if (in_RDX <= *(long *)(k + 0x68) && lVar9 != 0) {
    __assert_fail("(y_.size() == 0 || y_.getFirstIndex() < k) && \"ERROR: Only future measurements can be obtained\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/dynamical-system-simulator.cpp"
                  ,0x24,
                  "virtual Vector stateObservation::DynamicalSystemSimulator::getMeasurement(TimeIndex)"
                 );
  }
  if (lVar9 + *(long *)(k + 0x68) < in_RDX) {
    (**(code **)(*(long *)k + 0x40))(k);
    lVar5 = *(long *)(k + 0xb8);
    lVar1 = *(long *)(k + 0x98);
    lVar2 = *(long *)(k + 0x80);
    lVar4 = lVar5 - lVar1 >> 3;
    lVar7 = *(long *)(k + 0xa0) - *(long *)(k + 0xa8) >> 4;
    lVar8 = *(long *)(k + 0x90) - lVar2 >> 4;
  }
  lVar8 = (lVar4 + -1 + (ulong)(lVar5 == 0)) * 0x20 + lVar7 + lVar8;
  if (lVar8 == 0) {
LAB_00144f6a:
    __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0x192,
                  "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  lVar5 = *(long *)(k + 0x68);
  if ((in_RDX < lVar5) || (lVar5 + lVar8 <= in_RDX)) goto LAB_00144f6a;
  uVar6 = (lVar2 - *(long *)(k + 0x88) >> 4) + (in_RDX - lVar5);
  if ((long)uVar6 < 0) {
    uVar3 = (long)uVar6 >> 5;
  }
  else {
    if (uVar6 < 0x20) {
      other = (DenseStorage<double,__1,__1,_1,_0> *)(lVar2 + (in_RDX - lVar5) * 0x10);
      goto LAB_00144f54;
    }
    uVar3 = uVar6 >> 5;
  }
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          ((uVar6 + uVar3 * -0x20) * 0x10 + *(long *)(lVar1 + uVar3 * 8));
LAB_00144f54:
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,other);
  VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar10.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector DynamicalSystemSimulator::getMeasurement(TimeIndex k)
{
  BOOST_ASSERT((y_.size() == 0 || y_.getFirstIndex() < k) && "ERROR: Only future measurements can be obtained");
  if(y_.getNextIndex() < k) simulateDynamicsTo(k);

  return y_[k];
}